

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer.cpp
# Opt level: O2

int __thiscall picPageAnalyzer::getCurrentPageNumber(picPageAnalyzer *this)

{
  int iVar1;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_48,"span",&local_69);
  std::__cxx11::string::string((string *)&local_68,"",&local_6a);
  pageAnalyzer::getInfoFromContent
            (&local_28,&this->super_pageAnalyzer,&local_48,1,0x11,&local_68,'\0');
  iVar1 = std::__cxx11::stoi(&local_28,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return iVar1;
}

Assistant:

int picPageAnalyzer::getCurrentPageNumber()
{
    return stoi(this->getInfoFromContent(std::string("span"), 1, GETMODE_ALL, std::string(""), '\0'));
}